

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlabel.cpp
# Opt level: O0

void __thiscall QLabelPrivate::movieResized(QLabelPrivate *this,QSize *size)

{
  long lVar1;
  QPoint *atopLeft;
  QRect *in_RSI;
  QLabelPrivate *in_RDI;
  long in_FS_OFFSET;
  QLabel *q;
  int in_stack_ffffffffffffffa8;
  int in_stack_ffffffffffffffac;
  QWidget *this_00;
  QRect *in_stack_ffffffffffffffe0;
  QSize in_stack_ffffffffffffffe8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  atopLeft = (QPoint *)q_func(in_RDI);
  QWidget::update((QWidget *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
  in_RDI->field_0x340 = in_RDI->field_0x340 & 0xfe;
  this_00 = (QWidget *)&stack0xffffffffffffffe0;
  QPoint::QPoint((QPoint *)this_00,in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8);
  QRect::QRect(in_RSI,atopLeft,(QSize *)&stack0xffffffffffffffe8);
  movieUpdated((QLabelPrivate *)in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe0);
  QWidget::updateGeometry(this_00);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QLabelPrivate::movieResized(const QSize &size)
{
    Q_Q(QLabel);
    q->update(); //we need to refresh the whole background in case the new size is smaller
    valid_hints = false;
    movieUpdated(QRect(QPoint(0,0), size));
    q->updateGeometry();
}